

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Vec_Int_t * Acec_FindXorRoots(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  
  p_00 = Acec_MapXorIns(p,vXors);
  p_01 = Vec_IntAlloc(100);
  iVar8 = 0;
  while( true ) {
    iVar7 = iVar8 * 4;
    if (vXors->nSize <= iVar7) {
      Vec_BitFree(p_00);
      return p_01;
    }
    iVar2 = Vec_IntEntry(vXors,iVar7);
    iVar2 = Vec_BitEntry(p_00,iVar2);
    if (iVar2 == 0) break;
LAB_00547527:
    iVar8 = iVar8 + 1;
  }
  iVar7 = Vec_IntEntry(vXors,iVar7);
  uVar3 = p_01->nSize;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  uVar6 = 0;
LAB_005474c5:
  if (uVar5 != uVar6) goto code_r0x005474ca;
  if (uVar3 == p_01->nCap) {
    iVar2 = uVar3 * 2;
    if ((int)uVar3 < 0x10) {
      iVar2 = 0x10;
    }
    Vec_IntGrow(p_01,iVar2);
    uVar3 = p_01->nSize;
  }
  p_01->nSize = uVar3 + 1;
  piVar1 = p_01->pArray;
  for (uVar5 = (ulong)uVar3;
      (uVar4 = (int)uVar3 >> 0x1f & uVar3, 0 < (int)(uint)uVar5 &&
      (uVar4 = (uint)uVar5, iVar7 < piVar1[uVar5 - 1])); uVar5 = uVar5 - 1) {
    piVar1[uVar5] = piVar1[uVar5 - 1];
  }
  piVar1[(int)uVar4] = iVar7;
  goto LAB_00547527;
code_r0x005474ca:
  piVar1 = p_01->pArray + uVar6;
  uVar6 = uVar6 + 1;
  if (*piVar1 == iVar7) goto LAB_00547527;
  goto LAB_005474c5;
}

Assistant:

Vec_Int_t * Acec_FindXorRoots( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMapXorIns = Acec_MapXorIns( p, vXors );
    Vec_Int_t * vXorRoots = Vec_IntAlloc( 100 );  int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        if ( !Vec_BitEntry(vMapXorIns, Vec_IntEntry(vXors, 4*i)) )
            Vec_IntPushUniqueOrder( vXorRoots, Vec_IntEntry(vXors, 4*i) );
    Vec_BitFree( vMapXorIns );
    return vXorRoots;
}